

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.cpp
# Opt level: O0

void __thiscall
groundupdbext::DefaultQueryResult::DefaultQueryResult(DefaultQueryResult *this,Set *recordKeys)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  size_type __n;
  reference from;
  HashedValue local_70;
  _Node_iterator_base<groundupdb::EncodedValue,_true> local_38;
  _Node_iterator_base<groundupdb::EncodedValue,_true> local_30;
  iterator it;
  Set *recordKeys_local;
  DefaultQueryResult *this_local;
  
  groundupdb::IQueryResult::IQueryResult(&this->super_IQueryResult);
  (this->super_IQueryResult)._vptr_IQueryResult = (_func_int **)&PTR__DefaultQueryResult_0019b978;
  std::
  make_unique<std::unordered_set<groundupdb::HashedValue,std::hash<groundupdb::HashedValue>,std::equal_to<groundupdb::HashedValue>,std::allocator<groundupdb::HashedValue>>>
            ();
  puVar2 = std::
           unique_ptr<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
           ::operator->(&this->m_recordKeys);
  puVar3 = std::
           unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
           ::operator->(recordKeys);
  __n = std::
        unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
        ::size(puVar3);
  std::
  unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>
  ::reserve(puVar2,__n);
  puVar3 = std::
           unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
           ::operator->(recordKeys);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
       ::begin(puVar3);
  while( true ) {
    puVar3 = std::
             unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
             ::operator->(recordKeys);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
         ::end(puVar3);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    puVar2 = std::
             unique_ptr<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>,_std::default_delete<std::unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>_>_>
             ::operator->(&this->m_recordKeys);
    from = std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator*
                     ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_30);
    groundupdb::HashedValue::HashedValue(&local_70,from);
    std::
    unordered_set<groundupdb::HashedValue,_std::hash<groundupdb::HashedValue>,_std::equal_to<groundupdb::HashedValue>,_std::allocator<groundupdb::HashedValue>_>
    ::insert(puVar2,&local_70);
    groundupdb::HashedValue::~HashedValue(&local_70);
    std::__detail::_Node_iterator<groundupdb::EncodedValue,_true,_true>::operator++
              ((_Node_iterator<groundupdb::EncodedValue,_true,_true> *)&local_30,0);
  }
  return;
}

Assistant:

DefaultQueryResult::DefaultQueryResult(Set&& recordKeys)
  : m_recordKeys(std::make_unique<std::unordered_set<HashedKey>>())
{
  m_recordKeys->reserve(recordKeys->size());
  for (auto it = recordKeys->begin(); it != recordKeys->end(); it++) {
    m_recordKeys->insert(HashedKey(*it));
  }
}